

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O2

int lws_ssl_get_error(lws *wsi,int n)

{
  SSL *s;
  lws_tls_conn *plVar1;
  uint uVar2;
  undefined8 in_RAX;
  int *piVar3;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  s = (SSL *)(wsi->tls).ssl;
  if (s == (SSL *)0x0) {
    uVar2 = 99;
  }
  else {
    uVar2 = SSL_get_error(s,n);
    plVar1 = (wsi->tls).ssl;
    piVar3 = __errno_location();
    _lws_log(0x10,"%s: %p %d -> %d (errno %d)\n","lws_ssl_get_error",plVar1,n,(ulong)uVar2,
             CONCAT44(uVar4,*piVar3));
    if (*piVar3 == 9) {
      __assert_fail("errno != 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/tls/openssl/openssl-ssl.c"
                    ,0x3f,"int lws_ssl_get_error(struct lws *, int)");
    }
  }
  return uVar2;
}

Assistant:

int lws_ssl_get_error(struct lws *wsi, int n)
{
	int m;

	if (!wsi->tls.ssl)
		return 99;

	m = SSL_get_error(wsi->tls.ssl, n);
	lwsl_debug("%s: %p %d -> %d (errno %d)\n", __func__, wsi->tls.ssl, n, m,
		   errno);

	assert (errno != 9);

	return m;
}